

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

bool_t EqData(datatype Type,void *a,void *b,size_t Size)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  bool_t bVar5;
  size_t sVar6;
  bool bVar7;
  
  if (Type - 0x1f < 2) {
LAB_0010c6d4:
    if (a == (void *)0x0) {
      a = "";
    }
    if (b == (void *)0x0) {
      b = "";
    }
    iVar4 = tcscmp((tchar_t *)a,(tchar_t *)b);
  }
  else {
    if (Type == 3) {
      if (b != (void *)0x0 && a != (void *)0x0) {
        lVar2 = *(long *)((long)a + 8);
        lVar3 = *(long *)((long)b + 8);
        if (((lVar2 != lVar3) || (bVar7 = true, *a != *b)) &&
           (bVar7 = lVar3 == 0 && lVar2 == 0, lVar3 != 0 && lVar2 != 0)) {
          bVar7 = lVar3 * *a - lVar2 * *b == 0;
        }
        return (ulong)bVar7;
      }
    }
    else {
      if (Type == 0x1e) {
        bVar5 = ArrayEq((array *)a,(array *)b);
        return bVar5;
      }
      if (Type == 4) goto LAB_0010c6d4;
    }
    if (a == (void *)0x0 && b == (void *)0x0) {
      return 1;
    }
    if (a == (void *)0x0 || b == (void *)0x0) {
      if (a != (void *)0x0) {
        b = a;
      }
      sVar6 = 0;
      do {
        if (Size == sVar6) {
          return 1;
        }
        pcVar1 = (char *)((long)b + sVar6);
        sVar6 = sVar6 + 1;
      } while (*pcVar1 == '\0');
      return 0;
    }
    iVar4 = bcmp(a,b,Size);
  }
  return (ulong)(iVar4 == 0);
}

Assistant:

static NOINLINE bool_t EqData(datatype Type, const void* a, const void* b, size_t Size)
{
    size_t i;

    switch (Type)
    {
    case TYPE_EXPRSTRING:
    case TYPE_EXPRPARAM:
    case TYPE_STRING:
        if (!a) a = NullString;
        if (!b) b = NullString;
        return tcscmp(a,b)==0;

    case TYPE_ARRAY:
        return ArrayEq(a,b);

    case TYPE_FRACTION:
        if (a && b)
            return EqFrac((const cc_fraction*)a,(const cc_fraction*)b);
        break;
    }

    if (!a && !b)
        return 1;

    if (a && b)
        return memcmp(a,b,Size)==0;

    if (!a)
        a = b;

    for (i=0;i<Size;++i)
        if (((const uint8_t*)a)[i])
            return 0;

    return 1;
}